

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

int __thiscall
capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
          (PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *this,EVP_PKEY_CTX *ctx)

{
  Schema SVar1;
  StructSize size;
  Fault f;
  Schema in_stack_ffffffffffffffa8;
  Schema local_50;
  Reader local_48;
  
  local_50.raw = (RawBrandedSchema *)ctx;
  Schema::getProto(&local_48,&local_50);
  SVar1.raw = local_50.raw;
  if ((0xe0 < local_48._reader.dataSize) &&
     ((*(byte *)((long)local_48._reader.data + 0x1c) & 1) != 0)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              ((Fault *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x76e,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "\"Cannot form pointer to group type.\"",
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal((Fault *)&local_48);
  }
  size = anon_unknown_71::structSizeFromSchema((StructSchema)in_stack_ffffffffffffffa8.raw);
  PointerBuilder::initStruct((StructBuilder *)(this + 8),(PointerBuilder *)&stack0x00000008,size);
  *(RawBrandedSchema **)this = SVar1.raw;
  return (int)this;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::init(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema,
      builder.initStruct(structSizeFromSchema(schema)));
}